

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::ConfidentialTransactionContext::AddTapScriptSign
          (ConfidentialTransactionContext *this,OutPoint *outpoint,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_data_list,
          ByteData *annex)

{
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  ByteData control;
  Script script;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_90;
  ByteData local_78;
  Script local_60;
  
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&local_90,sign_data_list);
  core::TaprootUtil::CreateTapScriptControl
            (&local_78,internal_pubkey,&tree->super_TapBranch,(SchnorrPubkey *)0x0,(Script *)0x0);
  core::TapBranch::GetScript(&local_60,&tree->super_TapBranch);
  std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
  emplace_back<cfd::core::Script&>
            ((vector<cfd::SignParameter,std::allocator<cfd::SignParameter>> *)&local_90,&local_60);
  std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
  emplace_back<cfd::core::ByteData&>
            ((vector<cfd::SignParameter,std::allocator<cfd::SignParameter>> *)&local_90,&local_78);
  if (annex != (ByteData *)0x0) {
    std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
    emplace_back<cfd::core::ByteData_const&>
              ((vector<cfd::SignParameter,std::allocator<cfd::SignParameter>> *)&local_90,annex);
  }
  TransactionContextUtil::AddSign<cfd::ConfidentialTransactionContext>
            (this,outpoint,&local_90,true,true);
  core::Script::~Script(&local_60);
  if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_90);
  return;
}

Assistant:

void ConfidentialTransactionContext::AddTapScriptSign(
    const OutPoint& outpoint, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey,
    const std::vector<SignParameter>& sign_data_list, const ByteData* annex) {
  std::vector<SignParameter> sign_params = sign_data_list;
  auto control = TaprootUtil::CreateTapScriptControl(internal_pubkey, tree);
  auto script = tree.GetScript();
  sign_params.emplace_back(script);
  sign_params.emplace_back(control);
  if (annex != nullptr) sign_params.emplace_back(*annex);
  AddSign(outpoint, sign_params, true, true);
}